

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q8dot.cpp
# Opt level: O2

void __thiscall Stat::reportResult(Stat *this,char *title)

{
  double __x;
  double dVar1;
  
  if (0 < this->nloop) {
    printf("============ %s\n",title);
    printf("<dot> = %g\n",this->sum / (double)this->nloop);
    dVar1 = this->sumt / (double)this->nloop;
    __x = this->sumt2 / (double)this->nloop - dVar1 * dVar1;
    if (0.0 < __x) {
      if (__x < 0.0) {
        __x = sqrt(__x);
      }
      else {
        __x = SQRT(__x);
      }
    }
    printf("<time> = %g +/- %g us. Max. time = %g us.\n",dVar1,__x,this->maxt);
    return;
  }
  printf("%s(%s): no result\n","reportResult");
  return;
}

Assistant:

void reportResult(const char* title) const {
        if (nloop < 1) {
            printf("%s(%s): no result\n",__func__,title);
            return;
        }
        printf("============ %s\n",title);
        printf("<dot> = %g\n",sum/nloop);
        auto t = sumt/nloop, dt = sumt2/nloop - t*t;
        if (dt > 0) dt = sqrt(dt);
        printf("<time> = %g +/- %g us. Max. time = %g us.\n",t,dt,maxt);
    }